

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

string * __thiscall optimization::inlineFunc::Inline_Func::pass_name_abi_cxx11_(Inline_Func *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x68));
  return in_RDI;
}

Assistant:

std::string pass_name() const { return name; }